

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_CreateMultisigRedeemScriptErrorTest_Test::TestBody
          (ScriptUtil_CreateMultisigRedeemScriptErrorTest_Test *this)

{
  allocator<cfd::core::Pubkey> *this_00;
  pointer *this_01;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  initializer_list<MultisigTestVector> __l_03;
  bool bVar1;
  reference pMVar2;
  Pubkey *local_1248;
  Pubkey *local_1230;
  Pubkey *local_1218;
  Pubkey *local_1200;
  MultisigTestVector *local_11e8;
  AssertionResult gtest_ar;
  CfdException *e;
  Message local_e68 [2];
  CfdException *anon_var_0;
  Script local_e50;
  byte local_e11;
  char *pcStack_e10;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  MultisigTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *__range1;
  Script actual;
  string local_d30;
  allocator local_d09;
  string local_d08;
  allocator local_ce1;
  string local_ce0;
  allocator local_cb9;
  string local_cb8;
  allocator local_c91;
  string local_c90;
  allocator local_c69;
  string local_c68;
  allocator local_c41;
  string local_c40;
  allocator local_c19;
  string local_c18;
  allocator local_bf1;
  string local_bf0;
  allocator local_bc9;
  string local_bc8;
  allocator local_ba1;
  string local_ba0;
  allocator local_b79;
  string local_b78;
  allocator local_b51;
  string local_b50;
  allocator local_b29;
  string local_b28;
  allocator local_b01;
  string local_b00;
  allocator local_ad9;
  string local_ad8;
  allocator local_ab1;
  string local_ab0;
  allocator local_a89;
  string local_a88;
  allocator local_a61;
  string local_a60;
  allocator local_a39;
  string local_a38;
  allocator local_a11;
  string local_a10;
  Pubkey *local_9f0;
  Pubkey local_9e8;
  Pubkey local_9d0;
  Pubkey local_9b8;
  Pubkey local_9a0;
  Pubkey local_988;
  Pubkey local_970;
  Pubkey local_958;
  Pubkey local_940;
  Pubkey local_928;
  Pubkey local_910;
  Pubkey local_8f8;
  Pubkey local_8e0;
  Pubkey local_8c8;
  Pubkey local_8b0;
  Pubkey local_898;
  Pubkey local_880;
  Pubkey local_868;
  Pubkey local_850;
  Pubkey local_838;
  Pubkey local_820;
  Pubkey local_808;
  undefined1 local_7f0 [21];
  allocator<cfd::core::Pubkey> local_7db;
  undefined1 local_7da;
  allocator local_7d9;
  string local_7d8;
  allocator local_7b1;
  string local_7b0;
  allocator local_789;
  string local_788;
  allocator local_761;
  string local_760;
  allocator local_739;
  string local_738;
  allocator local_711;
  string local_710;
  allocator local_6e9;
  string local_6e8;
  allocator local_6c1;
  string local_6c0;
  allocator local_699;
  string local_698;
  allocator local_671;
  string local_670;
  allocator local_649;
  string local_648;
  allocator local_621;
  string local_620;
  allocator local_5f9;
  string local_5f8;
  allocator local_5d1;
  string local_5d0;
  allocator local_5a9;
  string local_5a8;
  allocator local_581;
  string local_580;
  Pubkey *local_560;
  Pubkey local_558;
  Pubkey local_540;
  Pubkey local_528;
  Pubkey local_510;
  Pubkey local_4f8;
  Pubkey local_4e0;
  Pubkey local_4c8;
  Pubkey local_4b0;
  Pubkey local_498;
  Pubkey local_480;
  Pubkey local_468;
  Pubkey local_450;
  Pubkey local_438;
  Pubkey local_420;
  Pubkey local_408;
  Pubkey local_3f0;
  undefined1 local_3d8 [21];
  allocator<cfd::core::Pubkey> local_3c3;
  undefined1 local_3c2;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  Pubkey *local_378;
  Pubkey local_370;
  Pubkey local_358;
  undefined1 local_340 [23];
  undefined1 local_329;
  undefined1 local_328;
  allocator local_327;
  allocator<cfd::core::Pubkey> local_326;
  undefined1 local_325;
  allocator local_311;
  string local_310;
  Pubkey *local_2f0;
  Pubkey local_2e8;
  Pubkey local_2d0;
  MultisigTestVector local_2b8;
  uchar local_238 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_230;
  Script local_218;
  string asStack_1e0 [32];
  undefined1 local_1c0;
  uchar local_1b8 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_1b0;
  Script SStack_198;
  string asStack_160 [32];
  undefined1 local_140;
  uchar local_138 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_130;
  Script SStack_118;
  string asStack_e0 [32];
  undefined1 local_c0;
  uchar local_b8 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_b0;
  Script SStack_98;
  string asStack_60 [32];
  undefined1 local_40;
  iterator local_38;
  pointer local_30;
  undefined1 local_28 [8];
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> test_vectors;
  ScriptUtil_CreateMultisigRedeemScriptErrorTest_Test *this_local;
  
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
  local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_2b8;
  local_2b8.req_sig = 0;
  local_325 = 1;
  local_2f0 = &local_2e8;
  test_vectors.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_310,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_311);
  cfd::core::Pubkey::Pubkey(&local_2e8,&local_310);
  local_325 = 0;
  local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_2e8;
  local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  std::allocator<cfd::core::Pubkey>::allocator(&local_326);
  __l_02._M_len =
       (size_type)
       local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __l_02._M_array =
       (iterator)
       local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_2b8.input_pubkeys,__l_02,&local_326);
  local_329 = 1;
  cfd::core::Script::Script(&local_2b8.expect_multisig_script);
  local_328 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b8.expect_message,"CreateMultisigScript require_num is 0.",&local_327
            );
  local_2b8.is_witness = false;
  local_328 = 0;
  local_329 = 0;
  local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_238;
  local_238[0] = '\x01';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_230.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector(&local_230);
  local_340[0x14] = 1;
  cfd::core::Script::Script(&local_218);
  local_340[0x15] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_1e0,"CreateMultisigScript empty pubkey array.",(allocator *)(local_340 + 0x16))
  ;
  local_1c0 = 0;
  local_340[0x15] = 0;
  local_340[0x14] = 0;
  local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_1b8;
  local_1b8[0] = '\x03';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_3c2 = 1;
  local_378 = &local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_398,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_399);
  cfd::core::Pubkey::Pubkey(&local_370,&local_398);
  local_378 = &local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_3c1);
  cfd::core::Pubkey::Pubkey(&local_358,&local_3c0);
  local_3c2 = 0;
  local_340._0_8_ = &local_370;
  local_340._8_8_ = (pointer)0x2;
  std::allocator<cfd::core::Pubkey>::allocator(&local_3c3);
  __l_01._M_len = local_340._8_8_;
  __l_01._M_array = (iterator)local_340._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_1b0,__l_01,&local_3c3);
  local_3d8[0x12] = 1;
  cfd::core::Script::Script(&SStack_198);
  local_3d8[0x13] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_160,"CreateMultisigScript require_num is over.",(allocator *)(local_3d8 + 0x14)
            );
  local_140 = 0;
  local_3d8[0x13] = 0;
  local_3d8[0x12] = 0;
  local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_138;
  local_138[0] = '\x01';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_7da = 1;
  local_560 = &local_558;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_580,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_581);
  cfd::core::Pubkey::Pubkey(&local_558,&local_580);
  local_560 = &local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_5a9);
  cfd::core::Pubkey::Pubkey(&local_540,&local_5a8);
  local_560 = &local_528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",&local_5d1);
  cfd::core::Pubkey::Pubkey(&local_528,&local_5d0);
  local_560 = &local_510;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5f8,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",&local_5f9);
  cfd::core::Pubkey::Pubkey(&local_510,&local_5f8);
  local_560 = &local_4f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_620,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",&local_621);
  cfd::core::Pubkey::Pubkey(&local_4f8,&local_620);
  local_560 = &local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_648,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",&local_649);
  cfd::core::Pubkey::Pubkey(&local_4e0,&local_648);
  local_560 = &local_4c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_670,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",&local_671);
  cfd::core::Pubkey::Pubkey(&local_4c8,&local_670);
  local_560 = &local_4b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_698,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",&local_699);
  cfd::core::Pubkey::Pubkey(&local_4b0,&local_698);
  local_560 = &local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6c0,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",&local_6c1);
  cfd::core::Pubkey::Pubkey(&local_498,&local_6c0);
  local_560 = &local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6e8,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",&local_6e9);
  cfd::core::Pubkey::Pubkey(&local_480,&local_6e8);
  local_560 = &local_468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_710,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",&local_711);
  cfd::core::Pubkey::Pubkey(&local_468,&local_710);
  local_560 = &local_450;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_738,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",&local_739);
  cfd::core::Pubkey::Pubkey(&local_450,&local_738);
  local_560 = &local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_760,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",&local_761);
  cfd::core::Pubkey::Pubkey(&local_438,&local_760);
  local_560 = &local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_788,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",&local_789);
  cfd::core::Pubkey::Pubkey(&local_420,&local_788);
  local_560 = &local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7b0,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",&local_7b1);
  cfd::core::Pubkey::Pubkey(&local_408,&local_7b0);
  local_560 = &local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7d8,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55",&local_7d9);
  cfd::core::Pubkey::Pubkey(&local_3f0,&local_7d8);
  local_7da = 0;
  local_3d8._0_8_ = &local_558;
  local_3d8._8_8_ = (pointer)0x10;
  std::allocator<cfd::core::Pubkey>::allocator(&local_7db);
  __l_00._M_len = local_3d8._8_8_;
  __l_00._M_array = (iterator)local_3d8._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_130,__l_00,&local_7db);
  local_7f0[0x12] = 1;
  cfd::core::Script::Script(&SStack_118);
  local_7f0[0x13] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_e0,"CreateMultisigScript pubkeys array size is over.",
             (allocator *)(local_7f0 + 0x14));
  local_c0 = 0;
  local_7f0[0x13] = 0;
  local_7f0[0x12] = 0;
  local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_b8;
  local_b8[0] = '\x01';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_9f0 = &local_9e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a10,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_a11);
  cfd::core::Pubkey::Pubkey(&local_9e8,&local_a10);
  local_9f0 = &local_9d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a38,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_a39);
  cfd::core::Pubkey::Pubkey(&local_9d0,&local_a38);
  local_9f0 = &local_9b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a60,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",&local_a61);
  cfd::core::Pubkey::Pubkey(&local_9b8,&local_a60);
  local_9f0 = &local_9a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a88,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",&local_a89);
  cfd::core::Pubkey::Pubkey(&local_9a0,&local_a88);
  local_9f0 = &local_988;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ab0,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",&local_ab1);
  cfd::core::Pubkey::Pubkey(&local_988,&local_ab0);
  local_9f0 = &local_970;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ad8,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",&local_ad9);
  cfd::core::Pubkey::Pubkey(&local_970,&local_ad8);
  local_9f0 = &local_958;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b00,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",&local_b01);
  cfd::core::Pubkey::Pubkey(&local_958,&local_b00);
  local_9f0 = &local_940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b28,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",&local_b29);
  cfd::core::Pubkey::Pubkey(&local_940,&local_b28);
  local_9f0 = &local_928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b50,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",&local_b51);
  cfd::core::Pubkey::Pubkey(&local_928,&local_b50);
  local_9f0 = &local_910;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b78,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",&local_b79);
  cfd::core::Pubkey::Pubkey(&local_910,&local_b78);
  local_9f0 = &local_8f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ba0,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",&local_ba1);
  cfd::core::Pubkey::Pubkey(&local_8f8,&local_ba0);
  local_9f0 = &local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bc8,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",&local_bc9);
  cfd::core::Pubkey::Pubkey(&local_8e0,&local_bc8);
  local_9f0 = &local_8c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bf0,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",&local_bf1);
  cfd::core::Pubkey::Pubkey(&local_8c8,&local_bf0);
  local_9f0 = &local_8b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c18,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",&local_c19);
  cfd::core::Pubkey::Pubkey(&local_8b0,&local_c18);
  local_9f0 = &local_898;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c40,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",&local_c41);
  cfd::core::Pubkey::Pubkey(&local_898,&local_c40);
  local_9f0 = &local_880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c68,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55",&local_c69);
  cfd::core::Pubkey::Pubkey(&local_880,&local_c68);
  local_9f0 = &local_868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c90,
             "0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e",&local_c91);
  cfd::core::Pubkey::Pubkey(&local_868,&local_c90);
  local_9f0 = &local_850;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cb8,
             "02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8",&local_cb9);
  cfd::core::Pubkey::Pubkey(&local_850,&local_cb8);
  local_9f0 = &local_838;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ce0,
             "03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950",&local_ce1);
  cfd::core::Pubkey::Pubkey(&local_838,&local_ce0);
  local_9f0 = &local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d08,
             "024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561",&local_d09);
  cfd::core::Pubkey::Pubkey(&local_820,&local_d08);
  local_9f0 = &local_808;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d30,
             "03f3aba2366b71f8473dd8dd4186005a9e3c6f9a32f76fc45493fd2a78b78c0d8d",
             (allocator *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey(&local_808,&local_d30);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_7f0._0_8_ = &local_9e8;
  local_7f0._8_8_ = (pointer)0x15;
  this_00 = (allocator<cfd::core::Pubkey> *)
            ((long)&actual.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::Pubkey>::allocator(this_00);
  __l._M_len = local_7f0._8_8_;
  __l._M_array = (iterator)local_7f0._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector(&local_b0,__l,this_00);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  cfd::core::Script::Script(&SStack_98);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_60,"CreateMultisigScript pubkeys array size is over.",
             (allocator *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_40 = 1;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
  local_38 = &local_2b8;
  local_30 = (pointer)0x5;
  this_01 = &actual.script_stack_.
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<MultisigTestVector>::allocator((allocator<MultisigTestVector> *)this_01);
  __l_03._M_len = (size_type)local_30;
  __l_03._M_array = local_38;
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::vector
            ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28,__l_03,
             (allocator_type *)this_01);
  std::allocator<MultisigTestVector>::~allocator
            ((allocator<MultisigTestVector> *)
             &actual.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_11e8 = (MultisigTestVector *)&local_38;
  do {
    local_11e8 = local_11e8 + -1;
    MultisigTestVector::~MultisigTestVector(local_11e8);
  } while (local_11e8 != &local_2b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<cfd::core::Pubkey>::~allocator
            ((allocator<cfd::core::Pubkey> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_1200 = (Pubkey *)local_7f0;
  do {
    local_1200 = local_1200 + -1;
    cfd::core::Pubkey::~Pubkey(local_1200);
  } while (local_1200 != &local_9e8);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::__cxx11::string::~string((string *)&local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::__cxx11::string::~string((string *)&local_c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  std::__cxx11::string::~string((string *)&local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  std::__cxx11::string::~string((string *)&local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  std::__cxx11::string::~string((string *)&local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_b51);
  std::__cxx11::string::~string((string *)&local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  std::__cxx11::string::~string((string *)&local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::allocator<char>::~allocator((allocator<char> *)(local_7f0 + 0x14));
  std::allocator<cfd::core::Pubkey>::~allocator(&local_7db);
  local_1218 = (Pubkey *)local_3d8;
  do {
    local_1218 = local_1218 + -1;
    cfd::core::Pubkey::~Pubkey(local_1218);
  } while (local_1218 != &local_558);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::allocator<char>::~allocator((allocator<char> *)(local_3d8 + 0x14));
  std::allocator<cfd::core::Pubkey>::~allocator(&local_3c3);
  local_1230 = (Pubkey *)local_340;
  do {
    local_1230 = local_1230 + -1;
    cfd::core::Pubkey::~Pubkey(local_1230);
  } while (local_1230 != &local_370);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::allocator<char>::~allocator((allocator<char> *)(local_340 + 0x16));
  std::allocator<char>::~allocator((allocator<char> *)&local_327);
  std::allocator<cfd::core::Pubkey>::~allocator(&local_326);
  local_1248 = &local_2d0;
  do {
    local_1248 = local_1248 + -1;
    cfd::core::Pubkey::~Pubkey(local_1248);
  } while (local_1248 != &local_2e8);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  cfd::core::Script::Script((Script *)&__range1);
  __end1 = std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::begin
                     ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28);
  test_vector._120_8_ =
       std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::end
                 ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_MultisigTestVector_*,_std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>_>
                                *)&test_vector.is_witness);
    if (!bVar1) {
      cfd::core::Script::~Script((Script *)&__range1);
      std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::~vector
                ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28);
      return;
    }
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_MultisigTestVector_*,_std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>_>
             ::operator*(&__end1);
    MultisigTestVector::MultisigTestVector((MultisigTestVector *)&gtest_msg,pMVar2);
    testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff1f0,"");
    bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                      ((ConstCharPtr *)&stack0xfffffffffffff1f0);
    if (bVar1) {
      local_e11 = 0;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateMultisigRedeemScript
                  (&local_e50,(uint32_t)gtest_msg.value,
                   (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&test_vector,
                   (bool)(test_vector.expect_message.field_2._M_local_buf[8] & 1));
        cfd::core::Script::operator=((Script *)&__range1,&local_e50);
        cfd::core::Script::~Script(&local_e50);
      }
      if ((local_e11 & 1) == 0) {
        pcStack_e10 = 
        "Expected: (actual = ScriptUtil::CreateMultisigRedeemScript( test_vector.req_sig, test_vector.input_pubkeys, test_vector.is_witness)) throws an exception of type CfdException.\n  Actual: it throws nothing."
        ;
        goto LAB_003eb654;
      }
    }
    else {
LAB_003eb654:
      testing::Message::Message(local_e68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&e,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x18d,pcStack_e10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&e,local_e68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&e);
      testing::Message::~Message(local_e68);
    }
    MultisigTestVector::~MultisigTestVector((MultisigTestVector *)&gtest_msg);
    __gnu_cxx::
    __normal_iterator<const_MultisigTestVector_*,_std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

TEST(ScriptUtil, CreateMultisigRedeemScriptErrorTest) {
  const std::vector<MultisigTestVector> test_vectors = {
    // 0-of-1 Multisig
    {
      0,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      },
      Script(),
      "CreateMultisigScript require_num is 0.",
      false
    },
    // 1-of-0 Multisig
    {
      1,
      {
      },
      Script(),
      "CreateMultisigScript empty pubkey array.",
      false
    },
    // 3-of-2 Multisig
    {
      3,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      },
      Script(),
      "CreateMultisigScript require_num is over.",
      false
    },
    // 1-of-16 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
      },
      Script(),
      "CreateMultisigScript pubkeys array size is over.",
      false
    },
    // 1-of-21 Multisig on witness
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
        Pubkey("0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e"),
        Pubkey("02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8"),
        Pubkey("03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950"),
        Pubkey("024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561"),
        Pubkey("03f3aba2366b71f8473dd8dd4186005a9e3c6f9a32f76fc45493fd2a78b78c0d8d"),
      },
      Script(),
      "CreateMultisigScript pubkeys array size is over.",
      true
    },
  };

  Script actual;
  for (MultisigTestVector test_vector : test_vectors) {
    try{
      EXPECT_THROW((actual = ScriptUtil::CreateMultisigRedeemScript(
          test_vector.req_sig, test_vector.input_pubkeys,
          test_vector.is_witness)), CfdException);
    } catch (CfdException &e) {
      EXPECT_STREQ(e.what(), test_vector.expect_message.c_str());
    }
  }
}